

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector3 QuaternionToEuler(Quaternion q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector3 VVar7;
  
  fVar3 = q.z;
  fVar5 = q.w;
  fVar2 = q.x;
  fVar4 = q.y;
  fVar1 = fVar5 * fVar2 + fVar4 * fVar3;
  fVar6 = fVar2 * fVar2 + fVar4 * fVar4;
  VVar7.x = atan2f(fVar1 + fVar1,1.0 - (fVar6 + fVar6));
  fVar6 = fVar5 * fVar4 - fVar2 * fVar3;
  fVar6 = fVar6 + fVar6;
  fVar1 = 1.0;
  if (fVar6 <= 1.0) {
    fVar1 = fVar6;
  }
  fVar6 = -1.0;
  if (-1.0 <= fVar1) {
    fVar6 = fVar1;
  }
  fVar1 = asinf(fVar6);
  fVar2 = fVar5 * fVar3 + fVar4 * fVar2;
  fVar4 = fVar3 * fVar3 + fVar4 * fVar4;
  fVar2 = atan2f(fVar2 + fVar2,1.0 - (fVar4 + fVar4));
  VVar7.y = fVar1;
  VVar7.z = fVar2;
  return VVar7;
}

Assistant:

RMAPI Vector3 QuaternionToEuler(Quaternion q)
{
    Vector3 result = { 0 };

    // Roll (x-axis rotation)
    float x0 = 2.0f*(q.w*q.x + q.y*q.z);
    float x1 = 1.0f - 2.0f*(q.x*q.x + q.y*q.y);
    result.x = atan2f(x0, x1);

    // Pitch (y-axis rotation)
    float y0 = 2.0f*(q.w*q.y - q.z*q.x);
    y0 = y0 > 1.0f ? 1.0f : y0;
    y0 = y0 < -1.0f ? -1.0f : y0;
    result.y = asinf(y0);

    // Yaw (z-axis rotation)
    float z0 = 2.0f*(q.w*q.z + q.x*q.y);
    float z1 = 1.0f - 2.0f*(q.y*q.y + q.z*q.z);
    result.z = atan2f(z0, z1);

    return result;
}